

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testGetTerritoryCode(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char local_3e98 [8];
  char largeString [16000];
  int local_10;
  char s1 [1];
  int i;
  int nrTests;
  
  iVar1 = testIncorrectGetTerritoryCode("UNKNOWN");
  iVar2 = testIncorrectGetTerritoryCode("A");
  iVar3 = testIncorrectGetTerritoryCode(" A");
  iVar4 = testIncorrectGetTerritoryCode("A ");
  iVar5 = testIncorrectGetTerritoryCode(" A ");
  iVar6 = testIncorrectGetTerritoryCode("AA");
  iVar7 = testIncorrectGetTerritoryCode(" AA");
  iVar8 = testIncorrectGetTerritoryCode("AA ");
  iVar9 = testIncorrectGetTerritoryCode(" AA ");
  iVar10 = testIncorrectGetTerritoryCode("US-");
  iVar11 = testIncorrectGetTerritoryCode(" US-");
  iVar12 = testIncorrectGetTerritoryCode("US- ");
  iVar13 = testIncorrectGetTerritoryCode(" US- ");
  iVar14 = testIncorrectGetTerritoryCode(" ");
  largeString[15999] = '\0';
  iVar15 = testIncorrectGetTerritoryCode(largeString + 15999);
  for (local_10 = 0; local_10 < 15999; local_10 = local_10 + 1) {
    local_3e98[local_10] = (char)(local_10 % 0xdf) + ' ';
  }
  largeString[0x3e77] = '\0';
  iVar16 = testIncorrectGetTerritoryCode(local_3e98);
  return iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + 
                                                  iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
}

Assistant:

static int testGetTerritoryCode(void) {
    int nrTests = 0;
    int i;
    char s1[1];
    char largeString[16000];

    nrTests += testIncorrectGetTerritoryCode("UNKNOWN");
    nrTests += testIncorrectGetTerritoryCode("A");
    nrTests += testIncorrectGetTerritoryCode(" A");
    nrTests += testIncorrectGetTerritoryCode("A ");
    nrTests += testIncorrectGetTerritoryCode(" A ");
    nrTests += testIncorrectGetTerritoryCode("AA");
    nrTests += testIncorrectGetTerritoryCode(" AA");
    nrTests += testIncorrectGetTerritoryCode("AA ");
    nrTests += testIncorrectGetTerritoryCode(" AA ");
    nrTests += testIncorrectGetTerritoryCode("US-");
    nrTests += testIncorrectGetTerritoryCode(" US-");
    nrTests += testIncorrectGetTerritoryCode("US- ");
    nrTests += testIncorrectGetTerritoryCode(" US- ");
    nrTests += testIncorrectGetTerritoryCode(" ");

    s1[0] = 0;
    nrTests += testIncorrectGetTerritoryCode(s1);

    for (i = 0; i < (int) sizeof(largeString) - 1; ++i) {
        largeString[i] = (char) ((i % 223) + 32);
    }
    largeString[sizeof(largeString) - 1] = 0;
    nrTests += testIncorrectGetTerritoryCode(largeString);
    return nrTests;
}